

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerator::Logger::Warning(Logger *this,GenT genType,string *message)

{
  long lVar1;
  string *__lhs;
  lock_guard<std::mutex> lock;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char)message,10);
  if (lVar1 == -1) {
    cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
  }
  else {
    __lhs = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
    std::operator+(&local_58,__lhs," warning");
    HeadLine(&local_38,&local_58);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::append((string *)&msg);
  if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&msg);
  }
  std::__cxx11::string::push_back((char)&msg);
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stdout(&msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Warning(GenT genType,
                                        std::string const& message)
{
  std::string msg;
  if (message.find('\n') == std::string::npos) {
    // Single line message
    msg += GeneratorName(genType);
    msg += " warning: ";
  } else {
    // Multi line message
    msg += HeadLine(GeneratorName(genType) + " warning");
  }
  // Message
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stdout(msg);
  }
}